

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O0

void mpr_print_n1_set(nhdp_domain *domain,avl_tree *set)

{
  list_entity *plVar1;
  oonf_log_source source;
  char *pcVar2;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  netaddr_str buf1;
  nhdp_neighbor_domaindata *neighbordata;
  n1_node *current_node;
  avl_tree *set_local;
  nhdp_domain *domain_local;
  
  plVar1 = (set->list_head).next;
  while( true ) {
    source = LOG_MPR;
    neighbordata = (nhdp_neighbor_domaindata *)&plVar1[-3].prev;
    if (plVar1->prev == (set->list_head).prev) break;
    buf1.buf._54_8_ = plVar1[-1].prev + (long)domain->index * 2 + 0xe;
    if ((log_global_mask[LOG_MPR] & 1) != 0) {
      pcVar2 = netaddr_to_prefixstring
                         ((netaddr_str *)((long)&__tempptr + 2),(netaddr *)neighbordata,false);
      oonf_log(LOG_SEVERITY_DEBUG,source,"src/nhdp/mpr/neighbor-graph.c",0xf2,(void *)0x0,0,
               "%s in: %u out: %u",pcVar2,*(undefined4 *)buf1.buf._54_8_,
               *(undefined4 *)(buf1.buf._54_8_ + 4));
    }
    plVar1 = plVar1->next;
  }
  return;
}

Assistant:

void
mpr_print_n1_set(struct nhdp_domain *domain __attribute__((unused)), struct avl_tree *set) {
  struct n1_node *current_node;
#ifdef OONF_LOG_DEBUG_INFO
  struct nhdp_neighbor_domaindata *neighbordata;
  struct netaddr_str buf1;
#endif

  avl_for_each_element(set, current_node, _avl_node) {
#ifdef OONF_LOG_DEBUG_INFO
    neighbordata = nhdp_domain_get_neighbordata(domain, current_node->neigh);

    OONF_DEBUG(LOG_MPR, "%s in: %u out: %u", netaddr_to_string(&buf1, &current_node->addr), neighbordata->metric.in,
      neighbordata->metric.out);
#endif
  }
}